

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O3

bool __thiscall
crnlib::qdxt1::pack(qdxt1 *this,dxt1_block *pDst_elements,uint elements_per_block,
                   qdxt1_params *params,float quality_power_mul)

{
  vector<crnlib::vector<unsigned_int>_> *pvVar1;
  elemental_vector *this_00;
  int iVar2;
  void *pvVar3;
  byte bVar4;
  crn_thread_id_t cVar5;
  vector<unsigned_int> *pvVar6;
  executable_task *peVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  task_pool *ptVar11;
  uint uVar12;
  uint64 uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  float __x;
  float fVar17;
  float fVar18;
  optimize_selectors_params optimize_selectors_task_params;
  vector<crnlib::vector<unsigned_int>_> *local_38;
  
  cVar5 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar5;
  this->m_canceled = false;
  this->m_pDst_elements = pDst_elements;
  this->m_elements_per_block = elements_per_block;
  memcpy(&this->m_params,params,0x630);
  if ((this->m_params).m_use_alpha_blocks == false) {
    (this->m_params).m_dxt1a_alpha_threshold = 0;
  }
  this->m_prev_percentage_complete = -1;
  __x = (float)(this->m_params).m_quality_level / 255.0;
  fVar17 = powf(__x,quality_power_mul * 1.8);
  fVar18 = powf(__x,quality_power_mul * 1.65);
  uVar12 = this->m_max_selector_clusters;
  uVar15 = (uint)(long)((float)uVar12 * fVar18);
  if (uVar15 < uVar12) {
    uVar12 = uVar15;
  }
  if (uVar15 < 0x80) {
    uVar12 = 0x80;
  }
  if (__x < 1.0) {
    uVar15 = (this->m_endpoint_clusterizer).m_codebook.m_size;
    uVar8 = (uint)(long)(fVar17 * (float)uVar15);
    if (uVar8 < uVar15) {
      uVar15 = uVar8;
    }
    uVar9 = 0x60;
    if (0x5f < uVar8) {
      uVar9 = uVar15;
    }
    clusterizer<crnlib::vec<6U,_float>_>::retrieve_clusters
              (&this->m_endpoint_clusterizer,uVar9,&this->m_endpoint_cluster_indices);
  }
  else {
    pvVar1 = &this->m_endpoint_cluster_indices;
    uVar15 = this->m_num_blocks;
    uVar8 = (this->m_endpoint_cluster_indices).m_size;
    uVar14 = uVar8 - uVar15;
    if (uVar14 != 0) {
      if (uVar8 < uVar15 || uVar14 == 0) {
        if ((this->m_endpoint_cluster_indices).m_capacity < uVar15) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar1,uVar15,uVar8 + 1 == uVar15,0x10,(object_mover)0x0,
                     false);
          uVar8 = (this->m_endpoint_cluster_indices).m_size;
        }
        if (uVar15 - uVar8 != 0) {
          memset(pvVar1->m_p + uVar8,0,(ulong)(uVar15 - uVar8) << 4);
        }
      }
      else {
        pvVar6 = pvVar1->m_p;
        lVar10 = 0;
        do {
          pvVar3 = *(void **)((long)&pvVar6[uVar15].m_p + lVar10);
          if (pvVar3 != (void *)0x0) {
            crnlib_free(pvVar3);
          }
          lVar10 = lVar10 + 0x10;
        } while ((ulong)uVar14 << 4 != lVar10);
      }
      (this->m_endpoint_cluster_indices).m_size = uVar15;
      uVar15 = this->m_num_blocks;
    }
    if (uVar15 != 0) {
      pvVar6 = pvVar1->m_p;
      lVar10 = 0;
      uVar16 = 0;
      do {
        iVar2 = *(int *)((long)&pvVar6->m_size + lVar10);
        if (iVar2 != 1) {
          this_00 = (elemental_vector *)((long)&pvVar6->m_p + lVar10);
          if (iVar2 == 0) {
            uVar9 = 0;
            if (*(int *)((long)&pvVar6->m_capacity + lVar10) == 0) {
              elemental_vector::increase_capacity(this_00,1,true,4,(object_mover)0x0,false);
              uVar9 = this_00->m_size;
            }
            memset((void *)((ulong)uVar9 * 4 + (long)this_00->m_p),0,(ulong)(1 - uVar9) << 2);
            pvVar6 = pvVar1->m_p;
          }
          this_00->m_size = 1;
        }
        **(undefined4 **)((long)&pvVar6->m_p + lVar10) = (int)uVar16;
        uVar16 = uVar16 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar16 < this->m_num_blocks);
    }
  }
  pvVar1 = this->m_cached_selector_cluster_indices + params->m_quality_level;
  this->m_progress_start = 0;
  if (__x < 1.0) {
    if (pvVar1->m_size == 0) {
      uVar9 = 0x21;
    }
    else {
      uVar9 = 0x32;
    }
    if ((this->m_params).m_dxt_quality == cCRNDXTQualitySuperFast) {
      uVar9 = 10;
    }
    this->m_progress_range = uVar9;
  }
  else {
    this->m_progress_range = 100;
  }
  ptVar11 = this->m_pTask_pool;
  uVar13 = 0;
  do {
    peVar7 = (executable_task *)crnlib_malloc(0x28);
    peVar7->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d2538;
    peVar7[1]._vptr_executable_task = (_func_int **)this;
    peVar7[2]._vptr_executable_task = (_func_int **)pack_endpoints_task;
    peVar7[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&peVar7[4]._vptr_executable_task = 1;
    task_pool::queue_task(ptVar11,peVar7,uVar13,(void *)0x0);
    uVar15 = (int)uVar13 + 1;
    uVar13 = (uint64)uVar15;
    ptVar11 = this->m_pTask_pool;
  } while (uVar15 <= ptVar11->m_num_threads);
  task_pool::join(ptVar11);
  bVar4 = this->m_canceled;
  if (__x < 1.0 && (bool)bVar4 == false) {
    if ((pvVar1->m_size == 0) &&
       (create_selector_clusters(this,uVar12,pvVar1), this->m_canceled == true)) {
      pvVar6 = pvVar1->m_p;
      if (pvVar6 != (vector<unsigned_int> *)0x0) {
        uVar12 = pvVar1->m_size;
        if ((ulong)uVar12 != 0) {
          lVar10 = 0;
          do {
            pvVar3 = *(void **)((long)&pvVar6->m_p + lVar10);
            if (pvVar3 != (void *)0x0) {
              crnlib_free(pvVar3);
            }
            lVar10 = lVar10 + 0x10;
          } while ((ulong)uVar12 << 4 != lVar10);
          pvVar6 = pvVar1->m_p;
        }
        crnlib_free(pvVar6);
        pvVar1->m_p = (vector<unsigned_int> *)0x0;
        pvVar1->m_size = 0;
        pvVar1->m_capacity = 0;
      }
      return false;
    }
    uVar9 = this->m_progress_start + this->m_progress_range;
    this->m_progress_start = uVar9;
    this->m_progress_range = 100 - uVar9;
    ptVar11 = this->m_pTask_pool;
    uVar13 = 0;
    local_38 = pvVar1;
    do {
      peVar7 = (executable_task *)crnlib_malloc(0x28);
      peVar7->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d2538;
      peVar7[1]._vptr_executable_task = (_func_int **)this;
      peVar7[2]._vptr_executable_task = (_func_int **)optimize_selectors_task;
      peVar7[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&peVar7[4]._vptr_executable_task = 1;
      task_pool::queue_task(ptVar11,peVar7,uVar13,&local_38);
      uVar12 = (int)uVar13 + 1;
      uVar13 = (uint64)uVar12;
      ptVar11 = this->m_pTask_pool;
    } while (uVar12 <= ptVar11->m_num_threads);
    task_pool::join(ptVar11);
    bVar4 = this->m_canceled;
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool qdxt1::pack(dxt1_block* pDst_elements, uint elements_per_block, const qdxt1_params& params, float quality_power_mul)
    {
        CRNLIB_ASSERT(m_num_blocks);

        m_main_thread_id = crn_get_current_thread_id();
        m_canceled = false;

        m_pDst_elements = pDst_elements;
        m_elements_per_block = elements_per_block;
        m_params = params;
        if (!m_params.m_use_alpha_blocks)
        {
            m_params.m_dxt1a_alpha_threshold = 0;
        }

        m_prev_percentage_complete = -1;

        CRNLIB_ASSERT(m_params.m_quality_level <= qdxt1_params::cMaxQuality);
        const float quality = m_params.m_quality_level / (float)qdxt1_params::cMaxQuality;
        const float endpoint_quality = powf(quality, 1.8f * quality_power_mul);
        const float selector_quality = powf(quality, 1.65f * quality_power_mul);

        //const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 128U, m_endpoint_clusterizer.get_codebook_size());
        //const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 150U, m_max_selector_clusters);
        const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 96U, m_endpoint_clusterizer.get_codebook_size());
        const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 128U, m_max_selector_clusters);

        if (quality >= 1.0f)
        {
            m_endpoint_cluster_indices.resize(m_num_blocks);
            for (uint i = 0; i < m_num_blocks; i++)
            {
                m_endpoint_cluster_indices[i].resize(1);
                m_endpoint_cluster_indices[i][0] = i;
            }
        }
        else
        {
            m_endpoint_clusterizer.retrieve_clusters(max_endpoint_clusters, m_endpoint_cluster_indices);
        }

        //      trace("endpoint clusters: %u\n", m_endpoint_cluster_indices.size());

        uint total_blocks = 0;
        uint max_blocks = 0;
        for (uint i = 0; i < m_endpoint_cluster_indices.size(); i++)
        {
            uint num = m_endpoint_cluster_indices[i].size();
            total_blocks += num;
            max_blocks = math::maximum(max_blocks, num);
        }
#if 0
      trace("Num clusters: %u, Average blocks per cluster: %u, Max blocks per cluster: %u\n",
         m_endpoint_cluster_indices.size(),
         total_blocks / m_endpoint_cluster_indices.size(),
         max_blocks);
#endif

        crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices = m_cached_selector_cluster_indices[params.m_quality_level];

        m_progress_start = 0;
        if (quality >= 1.0f)
        {
            m_progress_range = 100;
        }
        else if (selector_cluster_indices.empty())
        {
            m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 33;
        }
        else
        {
            m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 50;
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &qdxt1::pack_endpoints_task, i);
        }
        m_pTask_pool->join();

        if (m_canceled)
        {
            return false;
        }

        if (quality >= 1.0f)
        {
            return true;
        }

        if (selector_cluster_indices.empty())
        {
            create_selector_clusters(max_selector_clusters, selector_cluster_indices);

            if (m_canceled)
            {
                selector_cluster_indices.clear();

                return false;
            }
        }

        m_progress_start += m_progress_range;
        m_progress_range = 100 - m_progress_start;

        optimize_selectors_params optimize_selectors_task_params(selector_cluster_indices);

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &qdxt1::optimize_selectors_task, i, &optimize_selectors_task_params);
        }

        m_pTask_pool->join();

        return !m_canceled;
    }